

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall libclient::client::client_loop(client *this)

{
  int iVar1;
  long *plVar2;
  time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
  *ptVar3;
  ostream *this_00;
  long *plVar4;
  time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
  tVar5;
  subsecond_duration<boost::posix_time::time_duration,_1000L> local_a0;
  impl_type local_98;
  long local_90;
  impl_type iStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  const_buffers_1 local_60;
  long local_50 [2];
  const_buffers_1 local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Sending login request",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  local_60.super_const_buffer.data_ = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"lo","");
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_60,(ulong)(this->client_name)._M_dataplus._M_p);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_70 = *plVar4;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar4;
    local_80 = (long *)*plVar2;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  ptVar3 = (time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
            *)std::__cxx11::string::append((char *)&local_80);
  tVar5.ticks_.value_ = (impl_type)(ptVar3 + 2);
  if ((impl_type)
      *(time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
        *)&ptVar3->ticks_ == tVar5.ticks_.value_) {
    local_90 = *(long *)tVar5.ticks_.value_;
    iStack_88.value_ = ptVar3[3].ticks_.value_;
    local_a0.super_time_duration.
    super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
    .ticks_.value_ = (time_duration)(time_duration)&local_90;
  }
  else {
    local_90 = *(long *)tVar5.ticks_.value_;
    local_a0.super_time_duration.
    super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
    .ticks_.value_ =
         (time_duration)
         (time_duration)
         *(time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
           *)&ptVar3->ticks_;
  }
  local_98.value_ = ptVar3[1].ticks_.value_;
  ptVar3->ticks_ = tVar5.ticks_.value_;
  ptVar3[1].ticks_ = (impl_type)0x0;
  *(undefined1 *)&ptVar3[2].ticks_ = 0;
  local_40.super_const_buffer.data_ =
       (void *)local_a0.super_time_duration.
               super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
               .ticks_.value_;
  local_40.super_const_buffer.size_ = local_98.value_;
  boost::asio::
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::write_some<boost::asio::const_buffers_1>(&this->socket,&local_40);
  if (local_a0.super_time_duration.
      super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
      .ticks_.value_ != (time_duration)&local_90) {
    operator_delete((void *)local_a0.super_time_duration.
                            super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                            .ticks_.value_,local_90 + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if ((long *)local_60.super_const_buffer.data_ != local_50) {
    operator_delete(local_60.super_const_buffer.data_,local_50[0] + 1);
  }
  _read_from_socket(this);
  if (this->_is_started == true) {
    do {
      local_80 = &local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"ping","");
      ptVar3 = (time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                *)std::__cxx11::string::append((char *)&local_80);
      tVar5.ticks_.value_ = (impl_type)(ptVar3 + 2);
      if ((impl_type)
          *(time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
            *)&ptVar3->ticks_ == tVar5.ticks_.value_) {
        local_90 = *(long *)tVar5.ticks_.value_;
        iStack_88.value_ = ptVar3[3].ticks_.value_;
        local_a0.super_time_duration.
        super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
        .ticks_.value_ = (time_duration)(time_duration)&local_90;
      }
      else {
        local_90 = *(long *)tVar5.ticks_.value_;
        local_a0.super_time_duration.
        super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
        .ticks_.value_ =
             (time_duration)
             (time_duration)
             *(time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
               *)&ptVar3->ticks_;
      }
      local_98.value_ = ptVar3[1].ticks_.value_;
      ptVar3->ticks_ = tVar5.ticks_.value_;
      ptVar3[1].ticks_ = (impl_type)0x0;
      *(undefined1 *)&ptVar3[2].ticks_ = 0;
      local_60.super_const_buffer.data_ =
           (void *)local_a0.super_time_duration.
                   super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                   .ticks_.value_;
      local_60.super_const_buffer.size_ = local_98.value_;
      boost::asio::
      basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::write_some<boost::asio::const_buffers_1>(&this->socket,&local_60);
      if (local_a0.super_time_duration.
          super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
          .ticks_.value_ != (time_duration)&local_90) {
        operator_delete((void *)local_a0.super_time_duration.
                                super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                .ticks_.value_,local_90 + 1);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,local_70 + 1);
      }
      _read_from_socket(this);
      process_message(this);
      iVar1 = rand();
      this_00 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(this->client_name)._M_dataplus._M_p,
                           (this->client_name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(this_00," ping ",6);
      plVar2 = (long *)std::ostream::operator<<(this_00,iVar1 % 7000);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      local_a0.super_time_duration.
      super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
      .ticks_.value_ = (time_duration)(long)((iVar1 % 7000) * 1000);
      boost::this_thread::
      sleep<boost::date_time::subsecond_duration<boost::posix_time::time_duration,1000l>>(&local_a0)
      ;
    } while (this->_is_started != false);
  }
  return;
}

Assistant:

void libclient::client::client_loop()
{
    /*
        Check if the client has received login success from server and proceed
    */
   std::cout<<"Sending login request"<<std::endl;
   _write_to_socket(_LOGIN_REQUEST_+client_name+"\n");
   _read_from_socket();
   while(_is_started)
   {
       _write_to_socket(_PING_REQUEST_+"\n");
       _read_from_socket();
        process_message();
       int sl = rand()%7000;
       std::cout<<client_name<<" ping "<<sl<<std::endl;
       boost::this_thread::sleep(boost::posix_time::millisec(sl));

   }

}